

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ElabVisitors.h
# Opt level: O1

bool __thiscall
slang::ast::InstanceCacheKey::operator==(InstanceCacheKey *this,InstanceCacheKey *other)

{
  InstanceBodySymbol *pIVar1;
  pointer ppPVar2;
  size_t sVar3;
  pointer ppPVar4;
  ParameterSymbolBase *pPVar5;
  ParameterSymbol *this_00;
  ModportSymbol *pMVar6;
  ModportSymbol *pMVar7;
  size_t __n;
  pointer ppVar8;
  pointer ppVar9;
  bool bVar10;
  bool bVar11;
  int iVar12;
  DefinitionSymbol *pDVar13;
  DefinitionSymbol *pDVar14;
  ConstantValue *lhs;
  ConstantValue *rhs;
  Type *this_01;
  Type *rhs_00;
  long lVar15;
  size_t sVar16;
  ulong uVar17;
  pointer this_02;
  pointer other_00;
  
  if (this->savedHash == other->savedHash) {
    pDVar13 = InstanceSymbol::getDefinition((this->symbol).ptr);
    pDVar14 = InstanceSymbol::getDefinition((other->symbol).ptr);
    if ((pDVar13 == pDVar14) &&
       ((long)(this->ifaceKeys).
              super__Vector_base<std::pair<slang::ast::InstanceCacheKey,_const_slang::ast::ModportSymbol_*>,_std::allocator<std::pair<slang::ast::InstanceCacheKey,_const_slang::ast::ModportSymbol_*>_>_>
              ._M_impl.super__Vector_impl_data._M_finish -
        (long)(this->ifaceKeys).
              super__Vector_base<std::pair<slang::ast::InstanceCacheKey,_const_slang::ast::ModportSymbol_*>,_std::allocator<std::pair<slang::ast::InstanceCacheKey,_const_slang::ast::ModportSymbol_*>_>_>
              ._M_impl.super__Vector_impl_data._M_start ==
        (long)(other->ifaceKeys).
              super__Vector_base<std::pair<slang::ast::InstanceCacheKey,_const_slang::ast::ModportSymbol_*>,_std::allocator<std::pair<slang::ast::InstanceCacheKey,_const_slang::ast::ModportSymbol_*>_>_>
              ._M_impl.super__Vector_impl_data._M_finish -
        (long)(other->ifaceKeys).
              super__Vector_base<std::pair<slang::ast::InstanceCacheKey,_const_slang::ast::ModportSymbol_*>,_std::allocator<std::pair<slang::ast::InstanceCacheKey,_const_slang::ast::ModportSymbol_*>_>_>
              ._M_impl.super__Vector_impl_data._M_start)) {
      pIVar1 = ((this->symbol).ptr)->body;
      if ((pIVar1->super_Scope).deferredMemberIndex != Invalid) {
        Scope::elaborate(&pIVar1->super_Scope);
      }
      ppPVar2 = (pIVar1->parameters)._M_ptr;
      sVar3 = (pIVar1->parameters)._M_extent._M_extent_value;
      pIVar1 = ((other->symbol).ptr)->body;
      if ((pIVar1->super_Scope).deferredMemberIndex != Invalid) {
        Scope::elaborate(&pIVar1->super_Scope);
      }
      if (sVar3 != 0) {
        ppPVar4 = (pIVar1->parameters)._M_ptr;
        sVar16 = 0;
        do {
          pPVar5 = ppPVar4[sVar16];
          this_00 = (ParameterSymbol *)ppPVar2[sVar16]->symbol;
          if ((this_00->super_ValueSymbol).super_Symbol.kind == Parameter) {
            lhs = ParameterSymbol::getValue(this_00,(SourceRange)ZEXT816(0));
            rhs = ParameterSymbol::getValue
                            ((ParameterSymbol *)pPVar5->symbol,(SourceRange)ZEXT816(0));
            bVar10 = slang::operator==(lhs,rhs);
            if (!bVar10) {
              return false;
            }
          }
          else {
            this_01 = DeclaredType::getType
                                ((DeclaredType *)
                                 &(this_00->super_ValueSymbol).declaredType.dimensions);
            rhs_00 = DeclaredType::getType((DeclaredType *)&pPVar5->symbol[1].location);
            bVar10 = Type::isMatching(this_01,rhs_00);
            if (!bVar10) {
              return false;
            }
          }
          sVar16 = sVar16 + 1;
        } while (sVar3 != sVar16);
      }
      this_02 = (this->ifaceKeys).
                super__Vector_base<std::pair<slang::ast::InstanceCacheKey,_const_slang::ast::ModportSymbol_*>,_std::allocator<std::pair<slang::ast::InstanceCacheKey,_const_slang::ast::ModportSymbol_*>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      bVar10 = (this->ifaceKeys).
               super__Vector_base<std::pair<slang::ast::InstanceCacheKey,_const_slang::ast::ModportSymbol_*>,_std::allocator<std::pair<slang::ast::InstanceCacheKey,_const_slang::ast::ModportSymbol_*>_>_>
               ._M_impl.super__Vector_impl_data._M_finish == this_02;
      if (bVar10) {
        return bVar10;
      }
      other_00 = (other->ifaceKeys).
                 super__Vector_base<std::pair<slang::ast::InstanceCacheKey,_const_slang::ast::ModportSymbol_*>,_std::allocator<std::pair<slang::ast::InstanceCacheKey,_const_slang::ast::ModportSymbol_*>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
      bVar11 = operator==(&this_02->first,&other_00->first);
      if (!bVar11) {
        return bVar10;
      }
      uVar17 = 0;
      lVar15 = 0x30;
      do {
        pMVar6 = this_02->second;
        pMVar7 = other_00->second;
        if ((pMVar6 != (ModportSymbol *)0x0) == (pMVar7 == (ModportSymbol *)0x0)) {
          return bVar10;
        }
        if (pMVar6 != (ModportSymbol *)0x0) {
          __n = (pMVar6->super_Symbol).name._M_len;
          if (__n != (pMVar7->super_Symbol).name._M_len) {
            return bVar10;
          }
          if ((__n != 0) &&
             (iVar12 = bcmp((pMVar6->super_Symbol).name._M_str,(pMVar7->super_Symbol).name._M_str,
                            __n), iVar12 != 0)) {
            return bVar10;
          }
        }
        uVar17 = uVar17 + 1;
        ppVar8 = (this->ifaceKeys).
                 super__Vector_base<std::pair<slang::ast::InstanceCacheKey,_const_slang::ast::ModportSymbol_*>,_std::allocator<std::pair<slang::ast::InstanceCacheKey,_const_slang::ast::ModportSymbol_*>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        bVar10 = (ulong)(((long)(this->ifaceKeys).
                                super__Vector_base<std::pair<slang::ast::InstanceCacheKey,_const_slang::ast::ModportSymbol_*>,_std::allocator<std::pair<slang::ast::InstanceCacheKey,_const_slang::ast::ModportSymbol_*>_>_>
                                ._M_impl.super__Vector_impl_data._M_finish - (long)ppVar8 >> 4) *
                        -0x5555555555555555) <= uVar17;
        if (bVar10) {
          return bVar10;
        }
        this_02 = ppVar8 + uVar17;
        ppVar9 = (other->ifaceKeys).
                 super__Vector_base<std::pair<slang::ast::InstanceCacheKey,_const_slang::ast::ModportSymbol_*>,_std::allocator<std::pair<slang::ast::InstanceCacheKey,_const_slang::ast::ModportSymbol_*>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        other_00 = ppVar9 + uVar17;
        bVar11 = operator==((InstanceCacheKey *)((long)&(ppVar8->first).symbol.ptr + lVar15),
                            (InstanceCacheKey *)((long)&(ppVar9->first).symbol.ptr + lVar15));
        lVar15 = lVar15 + 0x30;
      } while (bVar11);
      return bVar10;
    }
  }
  return false;
}

Assistant:

bool InstanceCacheKey::operator==(const InstanceCacheKey& other) const {
    if (savedHash != other.savedHash ||
        &symbol->getDefinition() != &other.symbol->getDefinition() ||
        ifaceKeys.size() != other.ifaceKeys.size()) {
        return false;
    }

    auto lparams = symbol->body.getParameters();
    auto rparams = other.symbol->body.getParameters();
    SLANG_ASSERT(lparams.size() == rparams.size());

    for (size_t i = 0; i < lparams.size(); i++) {
        auto lp = lparams[i];
        auto rp = rparams[i];
        SLANG_ASSERT(lp->symbol.kind == rp->symbol.kind);

        if (lp->symbol.kind == SymbolKind::Parameter) {
            if (lp->symbol.as<ParameterSymbol>().getValue() !=
                rp->symbol.as<ParameterSymbol>().getValue()) {
                return false;
            }
        }
        else {
            auto& lt = lp->symbol.as<TypeParameterSymbol>().targetType.getType();
            auto& rt = rp->symbol.as<TypeParameterSymbol>().targetType.getType();
            if (!lt.isMatching(rt))
                return false;
        }
    }

    for (size_t i = 0; i < ifaceKeys.size(); i++) {
        auto& l = ifaceKeys[i];
        auto& r = other.ifaceKeys[i];
        if (l.first != r.first)
            return false;

        if (bool(l.second) != bool(r.second) || (l.second && l.second->name != r.second->name))
            return false;
    }

    return true;
}